

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorPushBack(ZyanVector *vector,void *element)

{
  ZyanStatus ZVar1;
  ZyanUSize local_40;
  void *offset;
  ZyanStatus status_047620348;
  void *element_local;
  ZyanVector *vector_local;
  
  if ((vector == (ZyanVector *)0x0) || (element == (void *)0x0)) {
    vector_local._4_4_ = 0x80100004;
  }
  else {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x1ad,"ZyanStatus ZyanVectorPushBack(ZyanVector *, const void *)");
    }
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x1ae,"ZyanStatus ZyanVectorPushBack(ZyanVector *, const void *)");
    }
    if (vector->capacity < vector->size + 1) {
      if ((vector->size + 1) * (ulong)vector->growth_factor == 0) {
        local_40 = 1;
      }
      else {
        local_40 = (vector->size + 1) * (ulong)vector->growth_factor;
      }
      ZVar1 = ZyanVectorReallocate(vector,local_40);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
    }
    memcpy((void *)((long)vector->data + vector->size * vector->element_size),element,
           vector->element_size);
    vector->size = vector->size + 1;
    vector_local._4_4_ = 0x100000;
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorPushBack(ZyanVector* vector, const void* element)
{
    if (!vector || !element)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (ZYCORE_VECTOR_SHOULD_GROW(vector->size + 1, vector->capacity))
    {
        ZYAN_CHECK(ZyanVectorReallocate(vector,
            ZYAN_MAX(1, (ZyanUSize)((vector->size + 1) * vector->growth_factor))));
    }

    void* const offset = ZYCORE_VECTOR_OFFSET(vector, vector->size);
    ZYAN_MEMCPY(offset, element, vector->element_size);

    ++vector->size;

    return ZYAN_STATUS_SUCCESS;
}